

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  Transform *this_00;
  Transform *pTVar7;
  Point3fi pi;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vector3f wo_00;
  Vector3f dpdu;
  Vector3f dpdv;
  Point3f pHit;
  Point3f local_1c8;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  Tuple3<pbrt::Vector3,_float> local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  local_1c8.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_1c8.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_1c8.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  _local_198 = ZEXT416((uint)isect->phi);
  local_188 = ZEXT416((uint)this->phiMax);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_1c8.super_Tuple3<pbrt::Point3,_float>.y *
                                         local_1c8.super_Tuple3<pbrt::Point3,_float>.y)),
                           ZEXT416((uint)local_1c8.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)local_1c8.super_Tuple3<pbrt::Point3,_float>.x));
  if (auVar8._0_4_ < 0.0) {
    local_188 = ZEXT416((uint)this->phiMax);
    _local_198 = ZEXT416((uint)isect->phi);
    fVar10 = sqrtf(auVar8._0_4_);
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar10 = auVar8._0_4_;
  }
  local_1c8.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  fVar1 = this->radius;
  auVar8 = vinsertps_avx(_local_198,ZEXT416((uint)(fVar1 - fVar10)),0x10);
  auVar9 = vinsertps_avx(local_188,ZEXT416((uint)(fVar1 - this->innerRadius)),0x10);
  local_188 = vdivps_avx(auVar8,auVar9);
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(ZEXT416((uint)this->phiMax),auVar8);
  fVar1 = this->innerRadius - fVar1;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = local_1c8.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = local_1c8.super_Tuple3<pbrt::Point3,_float>.y;
  auVar9 = vpermi2ps_avx512vl(_DAT_00565640,ZEXT416((uint)this->phiMax),auVar8);
  auVar8 = vshufps_avx(auVar12,auVar12,0xe1);
  local_198._4_4_ = auVar8._4_4_ * auVar9._4_4_;
  local_198._0_4_ = auVar8._0_4_ * auVar9._0_4_;
  fStack_190 = auVar8._8_4_ * auVar9._8_4_;
  fStack_18c = auVar8._12_4_ * auVar9._12_4_;
  auVar9._0_4_ = fVar1 * local_1c8.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9._4_4_ = fVar1 * local_1c8.super_Tuple3<pbrt::Point3,_float>.y;
  auVar9._8_4_ = fVar1 * 0.0;
  auVar9._12_4_ = fVar1 * 0.0;
  auVar11._4_4_ = fVar10;
  auVar11._0_4_ = fVar10;
  auVar11._8_4_ = fVar10;
  auVar11._12_4_ = fVar10;
  local_168 = vdivps_avx(auVar9,auVar11);
  local_150.x = 0.0;
  local_150.y = 0.0;
  local_150.z = 0.0;
  bVar5 = this->reverseOrientation;
  bVar6 = this->transformSwapsHandedness;
  this_00 = this->renderFromObject;
  pTVar7 = this->objectFromRender;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar3 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar4 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[0][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[0][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[0][2]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[1][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[1][0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[1][2]));
  local_178 = vinsertps_avx(auVar8,auVar9,0x10);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[2][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[2][2]));
  Point3fi::Point3fi(&local_140,&local_1c8,(Vector3f *)&local_150);
  auVar12 = local_168;
  auVar11 = local_178;
  auVar9 = _local_198;
  local_1a8 = 0;
  local_1a0 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar8._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_178._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_198._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (fVar1 * 0.0) / fVar10;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_168._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_168._4_4_;
  _local_198 = auVar9;
  local_178 = auVar11;
  local_168 = auVar12;
  SurfaceInteraction::SurfaceInteraction
            (&local_128,pi,(Point2f)local_188._0_8_,wo_00,dpdu,dpdv,(Normal3f)ZEXT812(0),
             (Normal3f)ZEXT812(0),time,bVar5 != bVar6);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }